

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_word_follows
          (basic_substring<const_char> *this,size_t pos,csubstr word)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  error_flags eVar5;
  ulong sz;
  ulong len_;
  size_t len__00;
  basic_substring<const_char> bVar6;
  basic_substring<const_char> local_50;
  basic_substring<const_char> local_40;
  
  sz = word.len;
  len_ = sz + pos;
  if (len_ <= this->len) {
    if (this->len < pos) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        bVar6 = (basic_substring<const_char>)(*pcVar2)();
        return bVar6;
      }
      handle_error(0x1fbf87,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x153a,"first >= 0 && first <= len");
    }
    if ((sz != 0xffffffffffffffff) && (this->len < sz)) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        bVar6 = (basic_substring<const_char>)(*pcVar2)();
        return bVar6;
      }
      handle_error(0x1fbf87,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
    }
    len__00 = this->len - pos;
    if (sz != 0xffffffffffffffff) {
      len__00 = sz;
    }
    if ((sz != 0) && (this->len < len__00 + pos)) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        bVar6 = (basic_substring<const_char>)(*pcVar2)();
        return bVar6;
      }
      handle_error(0x1fbf87,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
    }
    basic_substring(&local_50,this->str + pos,len__00);
    local_40.str = local_50.str;
    local_40.len = local_50.len;
    iVar4 = compare(&local_40,word.str,sz);
    if (iVar4 == 0) {
      if (this->len != len_) {
        bVar1 = this->str[len_];
        if ((((0x3b < (ulong)bVar1) || ((0x800120100002601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
            (bVar1 != 0x7d)) && (bVar1 != 0x5d)) goto LAB_00190da9;
      }
      if (len_ != 0xffffffffffffffff && this->len < len_) {
        eVar5 = get_error_flags();
        if (((eVar5 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          bVar6 = (basic_substring<const_char>)(*pcVar2)();
          return bVar6;
        }
        handle_error(0x1fbf87,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x154e,"num <= len || num == npos");
      }
      if (len_ == 0xffffffffffffffff) {
        len_ = this->len;
      }
      basic_substring(&local_50,this->str,len_);
      goto LAB_00190dae;
    }
  }
LAB_00190da9:
  local_50.str = this->str;
  local_50.len = 0;
LAB_00190dae:
  bVar6.len = local_50.len;
  bVar6.str = local_50.str;
  return bVar6;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _word_follows(size_t pos, csubstr word) const noexcept
    {
        size_t posend = pos + word.len;
        if(len >= posend && sub(pos, word.len) == word)
            if(len == posend || _is_delim_char(str[posend]))
                return first(posend);
        return first(0);
    }